

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
::numtostr::x_write<double>(double x,numtostr *this)

{
  bool bVar1;
  bool bVar2;
  reference pvVar3;
  pointer __s;
  size_type sVar4;
  ulong uVar5;
  iterator pvVar6;
  iterator pvVar7;
  char *__first;
  char local_9a;
  char local_99;
  ulong uStack_78;
  bool value_is_int_like;
  size_t i;
  value_type_conflict *c;
  iterator __end4;
  iterator __begin4;
  array<char,_64UL> *__range4;
  char *local_48;
  char *end;
  char decimal_point;
  lconv *plStack_38;
  char thousands_sep;
  lconv *loc;
  size_type sStack_28;
  int written_bytes;
  size_t i_1;
  double x_local;
  numtostr *this_local;
  
  i_1 = (size_t)x;
  x_local = (double)this;
  if ((x != 0.0) || (NAN(x))) {
    __s = std::array<char,_64UL>::data(&this->m_buf);
    sVar4 = std::array<char,_64UL>::size(&this->m_buf);
    loc._4_4_ = snprintf(__s,sVar4,"%.*g",i_1,0xf);
    if (loc._4_4_ < 1) {
      __assert_fail("written_bytes > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antonio-ramadas[P]nurse-rostering-solution/code/json.hpp"
                    ,0x208a,
                    "void nlohmann::basic_json<>::numtostr::x_write(NumberType, std::false_type) [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator, JSONSerializer = nlohmann::adl_serializer, NumberType = double]"
                   );
    }
    uVar5 = (ulong)loc._4_4_;
    sVar4 = std::array<char,_64UL>::size(&this->m_buf);
    if (sVar4 <= uVar5) {
      __assert_fail("static_cast<size_t>(written_bytes) < m_buf.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antonio-ramadas[P]nurse-rostering-solution/code/json.hpp"
                    ,0x208c,
                    "void nlohmann::basic_json<>::numtostr::x_write(NumberType, std::false_type) [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator, JSONSerializer = nlohmann::adl_serializer, NumberType = double]"
                   );
    }
    plStack_38 = localeconv();
    if (plStack_38 == (lconv *)0x0) {
      __assert_fail("loc != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antonio-ramadas[P]nurse-rostering-solution/code/json.hpp"
                    ,0x2090,
                    "void nlohmann::basic_json<>::numtostr::x_write(NumberType, std::false_type) [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator, JSONSerializer = nlohmann::adl_serializer, NumberType = double]"
                   );
    }
    if (plStack_38->thousands_sep == (char *)0x0) {
      local_99 = '\0';
    }
    else {
      local_99 = *plStack_38->thousands_sep;
    }
    end._7_1_ = local_99;
    if (plStack_38->decimal_point == (char *)0x0) {
      local_9a = '\0';
    }
    else {
      local_9a = *plStack_38->decimal_point;
    }
    end._6_1_ = local_9a;
    if (local_99 != '\0') {
      pvVar6 = std::array<char,_64UL>::begin(&this->m_buf);
      pvVar7 = std::array<char,_64UL>::begin(&this->m_buf);
      __first = std::remove<char*,char>(pvVar6,pvVar7 + loc._4_4_,(char *)((long)&end + 7));
      local_48 = __first;
      pvVar6 = std::array<char,_64UL>::end(&this->m_buf);
      __range4._7_1_ = 0;
      std::fill<char*,char>(__first,pvVar6,(char *)((long)&__range4 + 7));
    }
    if ((end._6_1_ != '\0') && (end._6_1_ != '.')) {
      __end4 = std::array<char,_64UL>::begin(&this->m_buf);
      pvVar6 = std::array<char,_64UL>::end(&this->m_buf);
      for (; __end4 != pvVar6; __end4 = __end4 + 1) {
        if (*__end4 == end._6_1_) {
          *__end4 = '.';
          break;
        }
      }
    }
    bVar2 = true;
    uStack_78 = 0;
    while ((sVar4 = std::array<char,_64UL>::size(&this->m_buf), uStack_78 < sVar4 &&
           (pvVar3 = std::array<char,_64UL>::operator[](&this->m_buf,uStack_78), *pvVar3 != '\0')))
    {
      bVar1 = false;
      if (bVar2) {
        pvVar3 = std::array<char,_64UL>::operator[](&this->m_buf,uStack_78);
        bVar1 = false;
        if (*pvVar3 != '.') {
          pvVar3 = std::array<char,_64UL>::operator[](&this->m_buf,uStack_78);
          bVar1 = false;
          if (*pvVar3 != 'e') {
            pvVar3 = std::array<char,_64UL>::operator[](&this->m_buf,uStack_78);
            bVar1 = *pvVar3 != 'E';
          }
        }
      }
      bVar2 = bVar1;
      uStack_78 = uStack_78 + 1;
    }
    if (bVar2) {
      sVar4 = std::array<char,_64UL>::size(&this->m_buf);
      if (sVar4 <= uStack_78 + 2) {
        __assert_fail("(i + 2) < m_buf.size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antonio-ramadas[P]nurse-rostering-solution/code/json.hpp"
                      ,0x20be,
                      "void nlohmann::basic_json<>::numtostr::x_write(NumberType, std::false_type) [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator, JSONSerializer = nlohmann::adl_serializer, NumberType = double]"
                     );
      }
      pvVar3 = std::array<char,_64UL>::operator[](&this->m_buf,uStack_78);
      if (*pvVar3 != '\0') {
        __assert_fail("m_buf[i] == \'\\0\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antonio-ramadas[P]nurse-rostering-solution/code/json.hpp"
                      ,0x20c0,
                      "void nlohmann::basic_json<>::numtostr::x_write(NumberType, std::false_type) [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator, JSONSerializer = nlohmann::adl_serializer, NumberType = double]"
                     );
      }
      pvVar3 = std::array<char,_64UL>::operator[](&this->m_buf,uStack_78 - 1);
      if (*pvVar3 == '\0') {
        __assert_fail("m_buf[i - 1] != \'\\0\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antonio-ramadas[P]nurse-rostering-solution/code/json.hpp"
                      ,0x20c1,
                      "void nlohmann::basic_json<>::numtostr::x_write(NumberType, std::false_type) [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator, JSONSerializer = nlohmann::adl_serializer, NumberType = double]"
                     );
      }
      pvVar3 = std::array<char,_64UL>::operator[](&this->m_buf,uStack_78);
      *pvVar3 = '.';
      pvVar3 = std::array<char,_64UL>::operator[](&this->m_buf,uStack_78 + 1);
      *pvVar3 = '0';
      pvVar3 = std::array<char,_64UL>::operator[](&this->m_buf,uStack_78 + 2);
      if (*pvVar3 != '\0') {
        __assert_fail("m_buf[i + 2] == \'\\0\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antonio-ramadas[P]nurse-rostering-solution/code/json.hpp"
                      ,0x20c8,
                      "void nlohmann::basic_json<>::numtostr::x_write(NumberType, std::false_type) [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator, JSONSerializer = nlohmann::adl_serializer, NumberType = double]"
                     );
      }
    }
  }
  else {
    sStack_28 = 0;
    bVar2 = std::signbit(x);
    sVar4 = sStack_28;
    if (bVar2) {
      sStack_28 = sStack_28 + 1;
      pvVar3 = std::array<char,_64UL>::operator[](&this->m_buf,sVar4);
      *pvVar3 = '-';
    }
    sVar4 = sStack_28;
    sStack_28 = sStack_28 + 1;
    pvVar3 = std::array<char,_64UL>::operator[](&this->m_buf,sVar4);
    sVar4 = sStack_28;
    *pvVar3 = '0';
    sStack_28 = sStack_28 + 1;
    pvVar3 = std::array<char,_64UL>::operator[](&this->m_buf,sVar4);
    *pvVar3 = '.';
    pvVar3 = std::array<char,_64UL>::operator[](&this->m_buf,sStack_28);
    *pvVar3 = '0';
  }
  return;
}

Assistant:

void x_write(NumberType x, /*is_integral=*/std::false_type)
        {
            // special case for 0.0 and -0.0
            if (x == 0)
            {
                size_t i = 0;
                if (std::signbit(x))
                {
                    m_buf[i++] = '-';
                }
                m_buf[i++] = '0';
                m_buf[i++] = '.';
                m_buf[i] = '0';
                return;
            }

            // get number of digits for a text -> float -> text round-trip
            static constexpr auto d = std::numeric_limits<NumberType>::digits10;

            // the actual conversion
            const auto written_bytes = snprintf(m_buf.data(), m_buf.size(), "%.*g", d, x);

            // negative value indicates an error
            assert(written_bytes > 0);
            // check if buffer was large enough
            assert(static_cast<size_t>(written_bytes) < m_buf.size());

            // read information from locale
            const auto loc = localeconv();
            assert(loc != nullptr);
            const char thousands_sep = !loc->thousands_sep ? '\0'
                                       : loc->thousands_sep[0];

            const char decimal_point = !loc->decimal_point ? '\0'
                                       : loc->decimal_point[0];

            // erase thousands separator
            if (thousands_sep != '\0')
            {
                const auto end = std::remove(m_buf.begin(), m_buf.begin() + written_bytes, thousands_sep);
                std::fill(end, m_buf.end(), '\0');
            }

            // convert decimal point to '.'
            if (decimal_point != '\0' and decimal_point != '.')
            {
                for (auto& c : m_buf)
                {
                    if (c == decimal_point)
                    {
                        c = '.';
                        break;
                    }
                }
            }

            // determine if need to append ".0"
            size_t i = 0;
            bool value_is_int_like = true;
            for (i = 0; i < m_buf.size(); ++i)
            {
                // break when end of number is reached
                if (m_buf[i] == '\0')
                {
                    break;
                }

                // check if we find non-int character
                value_is_int_like = value_is_int_like and m_buf[i] != '.' and
                                    m_buf[i] != 'e' and m_buf[i] != 'E';
            }

            if (value_is_int_like)
            {
                // there must be 2 bytes left for ".0"
                assert((i + 2) < m_buf.size());
                // we write to the end of the number
                assert(m_buf[i] == '\0');
                assert(m_buf[i - 1] != '\0');

                // add ".0"
                m_buf[i] = '.';
                m_buf[i + 1] = '0';

                // the resulting string is properly terminated
                assert(m_buf[i + 2] == '\0');
            }
        }